

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonReturnString(JsonString *p,JsonParse *pParse,sqlite3_context *ctx)

{
  undefined4 uVar1;
  int iVar2;
  void *pvVar3;
  Mem *pMVar4;
  sqlite3_context *in_RDX;
  sqlite3_context *in_RSI;
  undefined8 *in_RDI;
  int rc;
  int flags;
  _func_void_void_ptr *in_stack_ffffffffffffffd8;
  _func_void_void_ptr *xDel;
  int in_stack_ffffffffffffffe0;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffffe4;
  
  if (*(char *)((long)in_RDI + 0x21) == '\0') {
    pvVar3 = sqlite3_user_data((sqlite3_context *)*in_RDI);
    uVar1 = SUB84(pvVar3,0);
    if (((ulong)pvVar3 & 8) == 0) {
      if (*(char *)(in_RDI + 4) == '\0') {
        iVar2 = jsonStringTerminate((JsonString *)0x2369f7);
        if (iVar2 == 0) {
          sqlite3_result_error_nomem((sqlite3_context *)0x236ae3);
        }
        else {
          if (((in_RSI != (sqlite3_context *)0x0) && (*(char *)in_RSI->argv == '\0')) &&
             (*(int *)((long)&in_RSI->pFunc + 4) != 0)) {
            uVar5 = 0xaaaaaaaa;
            pMVar4 = (Mem *)sqlite3RCStrRef((char *)in_RDI[1]);
            in_RSI->pMem = pMVar4;
            in_RSI->iOp = (int)in_RDI[3];
            *(undefined1 *)in_RSI->argv = 1;
            in_stack_ffffffffffffffe0 = jsonCacheInsert(in_RDX,(JsonParse *)CONCAT44(uVar1,uVar5));
            if (in_stack_ffffffffffffffe0 == 7) {
              sqlite3_result_error_nomem((sqlite3_context *)0x236a87);
              jsonStringReset((JsonString *)0x236a91);
              return;
            }
          }
          xDel = (_func_void_void_ptr *)*in_RDI;
          sqlite3RCStrRef((char *)in_RDI[1]);
          sqlite3_result_text64
                    (in_RSI,(char *)in_RDX,CONCAT44(uVar1,in_stack_ffffffffffffffe0),xDel,'\0');
        }
      }
      else {
        sqlite3_result_text64
                  (in_RSI,(char *)in_RDX,CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffd8,'\0');
      }
    }
    else {
      jsonReturnStringAsBlob((JsonString *)0x2369ac);
    }
  }
  else if ((*(byte *)((long)in_RDI + 0x21) & 1) == 0) {
    if ((*(byte *)((long)in_RDI + 0x21) & 2) != 0) {
      sqlite3_result_error
                ((sqlite3_context *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 (char *)in_stack_ffffffffffffffd8,0);
    }
  }
  else {
    sqlite3_result_error_nomem((sqlite3_context *)0x236b07);
  }
  jsonStringReset((JsonString *)0x236b41);
  return;
}

Assistant:

static void jsonReturnString(
  JsonString *p,            /* String to return */
  JsonParse *pParse,        /* JSONB source or NULL */
  sqlite3_context *ctx      /* Where to cache */
){
  assert( (pParse!=0)==(ctx!=0) );
  assert( ctx==0 || ctx==p->pCtx );
  if( p->eErr==0 ){
    int flags = SQLITE_PTR_TO_INT(sqlite3_user_data(p->pCtx));
    if( flags & JSON_BLOB ){
      jsonReturnStringAsBlob(p);
    }else if( p->bStatic ){
      sqlite3_result_text64(p->pCtx, p->zBuf, p->nUsed,
                            SQLITE_TRANSIENT, SQLITE_UTF8);
    }else if( jsonStringTerminate(p) ){
      if( pParse && pParse->bJsonIsRCStr==0 && pParse->nBlobAlloc>0 ){
        int rc;
        pParse->zJson = sqlite3RCStrRef(p->zBuf);
        pParse->nJson = p->nUsed;
        pParse->bJsonIsRCStr = 1;
        rc = jsonCacheInsert(ctx, pParse);
        if( rc==SQLITE_NOMEM ){
          sqlite3_result_error_nomem(ctx);
          jsonStringReset(p);
          return;
        }
      }
      sqlite3_result_text64(p->pCtx, sqlite3RCStrRef(p->zBuf), p->nUsed,
                            sqlite3RCStrUnref,
                            SQLITE_UTF8);
    }else{
      sqlite3_result_error_nomem(p->pCtx);
    }
  }else if( p->eErr & JSTRING_OOM ){
    sqlite3_result_error_nomem(p->pCtx);
  }else if( p->eErr & JSTRING_MALFORMED ){
    sqlite3_result_error(p->pCtx, "malformed JSON", -1);
  }
  jsonStringReset(p);
}